

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__encode_half_float_linear_ABGR(void *outputp,int width_times_channels,float *encode)

{
  void *pvVar1;
  stbir__FP16 sVar2;
  void *pvVar3;
  float *pfVar4;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pvVar1 = (void *)((long)outputp + (long)width_times_channels * 2);
  if (width_times_channels < 8) {
    pfVar4 = encode + 3;
    for (pvVar3 = (void *)((long)outputp + 8); pvVar3 <= pvVar1; pvVar3 = (void *)((long)pvVar3 + 8)
        ) {
      sVar2 = stbir__float_to_half(*pfVar4);
      *(stbir__FP16 *)((long)pvVar3 + -8) = sVar2;
      sVar2 = stbir__float_to_half(pfVar4[-1]);
      *(stbir__FP16 *)((long)pvVar3 + -6) = sVar2;
      sVar2 = stbir__float_to_half(pfVar4[-2]);
      *(stbir__FP16 *)((long)pvVar3 + -4) = sVar2;
      sVar2 = stbir__float_to_half(pfVar4[-3]);
      *(stbir__FP16 *)((long)pvVar3 + -2) = sVar2;
      pfVar4 = pfVar4 + 4;
    }
  }
  else {
    pfVar4 = encode;
    do {
      do {
        fStack_4c = *pfVar4;
        fStack_50 = pfVar4[1];
        fStack_54 = pfVar4[2];
        local_58 = pfVar4[3];
        fStack_3c = pfVar4[4];
        fStack_40 = pfVar4[5];
        fStack_44 = pfVar4[6];
        local_48 = pfVar4[7];
        stbir__float_to_half_SIMD(outputp,&local_58);
        pvVar3 = (void *)((long)outputp + 0x10);
        outputp = pvVar3;
        pfVar4 = pfVar4 + 8;
      } while (pvVar3 <= (void *)((long)pvVar1 - 0x10U));
      outputp = (void *)((long)pvVar1 - 0x10U);
      pfVar4 = encode + (long)width_times_channels + -8;
    } while (pvVar3 != pvVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_half_float_linear )( void * outputp, int width_times_channels, float const * encode )
{
  stbir__FP16 STBIR_SIMD_STREAMOUT_PTR( * ) output = (stbir__FP16*) outputp;
  stbir__FP16 * end_output = ( (stbir__FP16*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 8 )
  {
    float const * end_encode_m8 = encode + width_times_channels - 8;
    end_output -= 8;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_SIMD_NO_UNROLL(encode);
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of;
        stbir__simdf8_load( of, encode );
        stbir__encode_simdf8_unflip( of );
        stbir__float_to_half_SIMD( output, (float*)&of );
      }
      #else
      {
        stbir__simdf of[2];
        stbir__simdf_load( of[0], encode );
        stbir__simdf_load( of[1], encode+4 );
        stbir__encode_simdf4_unflip( of[0] );
        stbir__encode_simdf4_unflip( of[1] );
        stbir__float_to_half_SIMD( output, (float*)of );
      }
      #endif
      #else
      stbir__float_to_half_SIMD( output, encode );
      #endif
      encode += 8;
      output += 8;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 8 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    STBIR_SIMD_NO_UNROLL(output);
    output[0-4] = stbir__float_to_half(encode[stbir__encode_order0]);
    output[1-4] = stbir__float_to_half(encode[stbir__encode_order1]);
    output[2-4] = stbir__float_to_half(encode[stbir__encode_order2]);
    output[3-4] = stbir__float_to_half(encode[stbir__encode_order3]);
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    STBIR_NO_UNROLL(output);
    output[0] = stbir__float_to_half(encode[stbir__encode_order0]);
    #if stbir__coder_min_num >= 2
    output[1] = stbir__float_to_half(encode[stbir__encode_order1]);
    #endif
    #if stbir__coder_min_num >= 3
    output[2] = stbir__float_to_half(encode[stbir__encode_order2]);
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}